

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

uint32_t * __thiscall
vsencoding::VSEncoding::compute_OptPartition
          (VSEncoding *this,uint32_t *seq,uint32_t len,uint32_t fixCost,uint32_t *pSize)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  void *__s;
  void *__s_00;
  uint32_t *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  uVar10 = (ulong)(len + 1) * 4;
  __s = operator_new__(uVar10);
  uVar11 = (ulong)(len + 1) << 3;
  __s_00 = operator_new__(uVar11);
  if (len != 0xffffffff) {
    memset(__s,0xff,uVar10);
    uVar10 = 0;
    memset(__s_00,0,uVar11);
    if (len == 0) {
      bVar1 = true;
      goto LAB_00114ac7;
    }
  }
  uVar7 = this->maxBlk;
  puVar8 = this->posszLens;
  puVar3 = this->possLens;
  uVar2 = this->poss_sz;
  bVar1 = this->aligned;
  uVar5 = 0;
  do {
    uVar16 = uVar5 + 1;
    uVar17 = uVar16 - uVar7;
    uVar18 = ~((int)uVar17 >> 0x1f) & uVar17;
    if ((int)uVar18 <= (int)uVar5) {
      uVar11 = (ulong)uVar16;
      uVar6 = 1;
      uVar9 = 0;
      iVar13 = 0;
      iVar12 = 0;
      uVar10 = (ulong)uVar5;
      do {
        uVar5 = seq[uVar10];
        if (seq[uVar10] < uVar9) {
          uVar5 = uVar9;
        }
        uVar9 = uVar5;
        if (puVar8 == (uint32_t *)0x0) {
LAB_00114a23:
          if (uVar6 == puVar3[iVar13]) {
            iVar13 = iVar13 + 1;
LAB_00114a31:
            uVar5 = uVar9 * uVar6 + 0x1f >> 5;
            if ((bVar1 & 1U) == 0) {
              uVar5 = uVar9 * uVar6;
            }
            uVar14 = (ulong)uVar5 + (ulong)fixCost + *(long *)((long)__s_00 + uVar10 * 8);
            if (*(int *)((long)__s + uVar11 * 4) == -1) {
              uVar15 = uVar14 + 1;
              *(ulong *)((long)__s_00 + uVar11 * 8) = uVar15;
            }
            else {
              uVar15 = *(ulong *)((long)__s_00 + uVar11 * 8);
            }
            if (uVar14 <= uVar15) {
              *(ulong *)((long)__s_00 + uVar11 * 8) = uVar14;
              *(int *)((long)__s + uVar11 * 4) = (int)uVar10;
            }
          }
        }
        else {
          if (uVar9 != 0) {
            if ((int)uVar17 < 1) {
              uVar18 = 0;
            }
            else {
              uVar18 = uVar16 - puVar3[uVar2 - 1];
            }
            goto LAB_00114a23;
          }
          iVar13 = (uint)(uVar6 == puVar3[iVar13]) + iVar13;
          if (uVar6 == puVar8[iVar12]) {
            iVar12 = iVar12 + 1;
            goto LAB_00114a31;
          }
        }
        uVar6 = uVar6 + 1;
        bVar4 = (long)(int)uVar18 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
    }
    uVar5 = uVar16;
  } while (uVar16 != len);
  uVar10 = 0;
  uVar7 = len;
  do {
    uVar10 = (ulong)((int)uVar10 + 1);
    uVar7 = *(uint32_t *)((long)__s + (long)(int)uVar7 * 4);
  } while (uVar7 != 0);
  bVar1 = false;
LAB_00114ac7:
  *pSize = (uint32_t)uVar10;
  puVar8 = (uint32_t *)operator_new__((ulong)((uint32_t)uVar10 + 1) << 2);
  if (!bVar1) {
    do {
      puVar8[uVar10] = len;
      uVar10 = (ulong)((int)uVar10 - 1);
      len = *(uint32_t *)((long)__s + (long)(int)len * 4);
    } while (len != 0);
  }
  *puVar8 = 0;
  operator_delete__(__s);
  operator_delete__(__s_00);
  return puVar8;
}

Assistant:

inline uint32_t *VSEncoding::compute_OptPartition(uint32_t *seq, uint32_t len,
                                           uint32_t fixCost, uint32_t &pSize) {
  int *SSSP;
  uint32_t i;
  uint32_t maxB;
  uint32_t *part;
  uint64_t curCost;
  uint64_t *cost;

  /* It will store the shortest path */
  SSSP = new int[len + 1];

  /* cost[i] will contain the cost of encoding up to i-th position */
  cost = new uint64_t[len + 1];

  if (SSSP == NULL || cost == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  for (i = 0; i < len + 1U; ++i) {
    SSSP[i] = -1;
    cost[i] = 0;
  }

  /*
   * This loop computes the cost of the optimal partition.
   * The computation of the max log in each block is done
   * by scanning. Probably we could obtain a faster solution
   * by using RMQ data structures. We use this trivial
   * solution since construction time is not our main concern.
   */
  {
    int mleft;
    int j;
    int g;
    int l;

    for (i = 0U; i < len;) {
      ++i; // rewrite to avoid possibly infinite loop warning
      mleft = (static_cast<int>(i - maxBlk) > 0) ? i - maxBlk : 0;

      for (maxB = 0, l = 0, g = 0, j = i - 1; j >= mleft; j--) {
        if (maxB < seq[j])
          maxB = seq[j];

        if (posszLens == NULL) {
          /*
           * FIXME: If the gaps of elements in possLens[] are
           * sparse, a process below is more efficient to hop
           * these gaps using the elements rather than
           * decrementing j.
           */
          if (i - j != possLens[l])
            continue;
          else
            l++;
        } else {
          /*
           * Treat runs of 0 in a different way.
           * They could form larger blocks!
           */
          if (maxB != 0) {
            mleft = (static_cast<int>(i - maxBlk) > 0)
                        ? i - possLens[poss_sz - 1]
                        : 0;

            if (i - j != possLens[l])
              continue;

            if (i - j == possLens[l])
              l++;
          } else {
            if (i - j == possLens[l])
              l++;

            if (i - j != posszLens[g])
              continue;

            if (i - j == posszLens[g])
              g++;
          }
        }

        /* Caluculate costs */
        if (aligned)
          curCost = cost[j] + div_roundup((i - j) * maxB, 32) + fixCost;
        else
          curCost = cost[j] + (i - j) * maxB + fixCost;

        if (SSSP[i] == -1)
          cost[i] = curCost + 1;

        if (curCost <= cost[i]) {
          cost[i] = curCost;
          SSSP[i] = j;
        }
      }
    }
  }

  /* Compute number of nodes in the path */
  {
    int next;

    pSize = 0;
    next = len;

    while (next != 0) {
      next = SSSP[next];
      pSize++;
    }

    /*
     * Obtain the optimal partition starting
     * from the last block.
     */
    part = new uint32_t[pSize + 1];

    if (part == NULL) {
      /* Finalization */
      delete[] SSSP;
      delete[] cost;
      throw std::runtime_error("Can't allocate memory");
    }

    i = pSize;
    next = len;

    while (next != 0) {
      part[i--] = next;
      next = SSSP[next];
    }

    part[0] = 0;
  }

  /* Finalization */
  delete[] SSSP;
  delete[] cost;

  return part;
}